

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O1

Socket * new_unix_listener(SockAddr *listenaddr,Plug *plug)

{
  int iVar1;
  int iVar2;
  NetSocket *s;
  int *piVar3;
  char *pcVar4;
  sockaddr_union u;
  sockaddr local_a8;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  s = (NetSocket *)safemalloc(1,0x98,0);
  (s->sock).vt = &NetSocket_sockvt;
  s->error = (char *)0x0;
  s->plug = plug;
  bufchain_init(&s->output_data);
  s->writable = false;
  s->frozen = false;
  s->sending_oob = 0;
  s->localhost_only = true;
  s->pending_error = 0;
  s->oobpending = false;
  s->outgoingeof = EOF_NO;
  s->incomingeof = false;
  s->parent = (NetSocket *)0x0;
  s->child = (NetSocket *)0x0;
  s->listener = true;
  s->addr = listenaddr;
  s->s = -1;
  if (listenaddr->superfamily != UNIX) {
    __assert_fail("listenaddr->superfamily == UNIX",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/network.c"
                  ,0x6a6,"Socket *new_unix_listener(SockAddr *, Plug *)");
  }
  iVar1 = socket(1,1,0);
  if (-1 < iVar1) {
    cloexec(iVar1);
    s->oobinline = false;
    local_a8.sa_data[6] = '\0';
    local_a8.sa_data[7] = '\0';
    local_a8.sa_data[8] = '\0';
    local_a8.sa_data[9] = '\0';
    local_a8.sa_data[10] = '\0';
    local_a8.sa_data[0xb] = '\0';
    local_a8.sa_data[0xc] = '\0';
    local_a8.sa_data[0xd] = '\0';
    local_38 = 0;
    uStack_30 = 0;
    local_48 = 0;
    uStack_40 = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_78 = 0;
    uStack_70 = 0;
    local_88 = 0;
    uStack_80 = 0;
    local_98 = 0;
    uStack_90 = 0;
    local_a8.sa_family = 1;
    local_a8.sa_data[0] = '\0';
    local_a8.sa_data[1] = '\0';
    local_a8.sa_data[2] = '\0';
    local_a8.sa_data[3] = '\0';
    local_a8.sa_data[4] = '\0';
    local_a8.sa_data[5] = '\0';
    strncpy(local_a8.sa_data,listenaddr->hostname,0x6b);
    iVar2 = unlink(local_a8.sa_data);
    if ((iVar2 < 0) && (piVar3 = __errno_location(), *piVar3 != 2)) {
      close(iVar1);
      iVar1 = *piVar3;
      goto LAB_0014803f;
    }
    iVar2 = bind(iVar1,&local_a8,0x6e);
    if ((-1 < iVar2) && (iVar2 = listen(iVar1,0x1000), -1 < iVar2)) {
      s->s = iVar1;
      uxsel_tell(s);
      add234(sktree,s);
      return &s->sock;
    }
    close(iVar1);
  }
  piVar3 = __errno_location();
  iVar1 = *piVar3;
LAB_0014803f:
  pcVar4 = strerror(iVar1);
  s->error = pcVar4;
  return &s->sock;
}

Assistant:

Socket *new_unix_listener(SockAddr *listenaddr, Plug *plug)
{
    int s;
    union sockaddr_union u;
    union sockaddr_union *addr;
    int addrlen;
    NetSocket *ret;
    int retcode;

    /*
     * Create NetSocket structure.
     */
    ret = snew(NetSocket);
    ret->sock.vt = &NetSocket_sockvt;
    ret->error = NULL;
    ret->plug = plug;
    bufchain_init(&ret->output_data);
    ret->writable = false;             /* to start with */
    ret->sending_oob = 0;
    ret->frozen = false;
    ret->localhost_only = true;
    ret->pending_error = 0;
    ret->parent = ret->child = NULL;
    ret->oobpending = false;
    ret->outgoingeof = EOF_NO;
    ret->incomingeof = false;
    ret->listener = true;
    ret->addr = listenaddr;
    ret->s = -1;

    assert(listenaddr->superfamily == UNIX);

    /*
     * Open socket.
     */
    s = socket(AF_UNIX, SOCK_STREAM, 0);
    if (s < 0) {
        ret->error = strerror(errno);
        return &ret->sock;
    }

    cloexec(s);

    ret->oobinline = false;

    memset(&u, '\0', sizeof(u));
    u.su.sun_family = AF_UNIX;
#if __GNUC__ >= 8
#   pragma GCC diagnostic push
#   pragma GCC diagnostic ignored "-Wstringop-truncation"
#endif // __GNUC__ >= 8
    strncpy(u.su.sun_path, listenaddr->hostname, sizeof(u.su.sun_path)-1);
#if __GNUC__ >= 8
#   pragma GCC diagnostic pop
#endif // __GNUC__ >= 8
    addr = &u;
    addrlen = sizeof(u.su);

    if (unlink(u.su.sun_path) < 0 && errno != ENOENT) {
        close(s);
        ret->error = strerror(errno);
        return &ret->sock;
    }

    retcode = bind(s, &addr->sa, addrlen);
    if (retcode < 0) {
        close(s);
        ret->error = strerror(errno);
        return &ret->sock;
    }

    if (listen(s, SOMAXCONN) < 0) {
        close(s);
        ret->error = strerror(errno);
        return &ret->sock;
    }

    ret->s = s;

    uxsel_tell(ret);
    add234(sktree, ret);

    return &ret->sock;
}